

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int nextScaffoldPart(XML_Parser parser)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  DTD *pDVar4;
  int *piVar5;
  CONTENT_SCAFFOLD *pCVar6;
  uint uVar7;
  
  pDVar4 = parser->m_dtd;
  if (pDVar4->scaffIndex == (int *)0x0) {
    piVar5 = (int *)(*(parser->m_mem).malloc_fcn)((ulong)parser->m_groupSize << 2);
    pDVar4->scaffIndex = piVar5;
    if (piVar5 == (int *)0x0) {
      return -1;
    }
    *piVar5 = 0;
  }
  uVar1 = pDVar4->scaffCount;
  uVar7 = pDVar4->scaffSize;
  pCVar6 = pDVar4->scaffold;
  if (uVar7 <= uVar1) {
    if (pCVar6 == (CONTENT_SCAFFOLD *)0x0) {
      pCVar6 = (CONTENT_SCAFFOLD *)(*(parser->m_mem).malloc_fcn)(0x400);
      if (pCVar6 == (CONTENT_SCAFFOLD *)0x0) {
        return -1;
      }
      uVar7 = 0x20;
    }
    else {
      if ((int)uVar7 < 0) {
        return -1;
      }
      pCVar6 = (CONTENT_SCAFFOLD *)(*(parser->m_mem).realloc_fcn)(pCVar6,(ulong)uVar7 << 6);
      if (pCVar6 == (CONTENT_SCAFFOLD *)0x0) {
        return -1;
      }
      uVar7 = pDVar4->scaffSize * 2;
    }
    pDVar4->scaffSize = uVar7;
    pDVar4->scaffold = pCVar6;
    uVar1 = pDVar4->scaffCount;
  }
  pDVar4->scaffCount = uVar1 + 1;
  if ((long)pDVar4->scaffLevel != 0) {
    iVar2 = pDVar4->scaffIndex[(long)pDVar4->scaffLevel + -1];
    if ((long)pCVar6[iVar2].lastchild != 0) {
      pCVar6[pCVar6[iVar2].lastchild].nextsib = uVar1;
    }
    iVar3 = pCVar6[iVar2].childcnt;
    if (iVar3 == 0) {
      pCVar6[iVar2].firstchild = uVar1;
    }
    pCVar6[iVar2].lastchild = uVar1;
    pCVar6[iVar2].childcnt = iVar3 + 1;
  }
  pCVar6 = pCVar6 + (int)uVar1;
  pCVar6->firstchild = 0;
  pCVar6->lastchild = 0;
  *(undefined8 *)(&pCVar6->firstchild + 2) = 0;
  return uVar1;
}

Assistant:

static int FASTCALL
nextScaffoldPart(XML_Parser parser) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  CONTENT_SCAFFOLD *me;
  int next;

  if (! dtd->scaffIndex) {
    dtd->scaffIndex = (int *)MALLOC(parser, parser->m_groupSize * sizeof(int));
    if (! dtd->scaffIndex)
      return -1;
    dtd->scaffIndex[0] = 0;
  }

  if (dtd->scaffCount >= dtd->scaffSize) {
    CONTENT_SCAFFOLD *temp;
    if (dtd->scaffold) {
      /* Detect and prevent integer overflow */
      if (dtd->scaffSize > UINT_MAX / 2u) {
        return -1;
      }
      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if (dtd->scaffSize > (size_t)(-1) / 2u / sizeof(CONTENT_SCAFFOLD)) {
        return -1;
      }
#endif

      temp = (CONTENT_SCAFFOLD *)REALLOC(
          parser, dtd->scaffold, dtd->scaffSize * 2 * sizeof(CONTENT_SCAFFOLD));
      if (temp == NULL)
        return -1;
      dtd->scaffSize *= 2;
    } else {
      temp = (CONTENT_SCAFFOLD *)MALLOC(parser, INIT_SCAFFOLD_ELEMENTS
                                                    * sizeof(CONTENT_SCAFFOLD));
      if (temp == NULL)
        return -1;
      dtd->scaffSize = INIT_SCAFFOLD_ELEMENTS;
    }
    dtd->scaffold = temp;
  }
  next = dtd->scaffCount++;
  me = &dtd->scaffold[next];
  if (dtd->scaffLevel) {
    CONTENT_SCAFFOLD *parent
        = &dtd->scaffold[dtd->scaffIndex[dtd->scaffLevel - 1]];
    if (parent->lastchild) {
      dtd->scaffold[parent->lastchild].nextsib = next;
    }
    if (! parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}